

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::InitGoogleMockImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  int j;
  char *arg;
  string arg_string;
  int i;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  int *in_stack_ffffffffffffffa0;
  char *flag;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  wchar_t **in_stack_ffffffffffffffc8;
  int local_14;
  
  InitGoogleTest(in_stack_ffffffffffffffa0,
                 (wchar_t **)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  if (0 < *in_RDI) {
    for (local_14 = 1; local_14 != *in_RDI; local_14 = local_14 + 1) {
      flag = &stack0xffffffffffffffc8;
      StreamableToString<wchar_t*>(in_stack_ffffffffffffffc8);
      std::__cxx11::string::c_str();
      in_stack_ffffffffffffffaf =
           ParseGoogleMockBoolFlag
                     (in_stack_ffffffffffffffb8,
                      (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (bool *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      iVar1 = local_14;
      if (((bool)in_stack_ffffffffffffffaf) ||
         (in_stack_ffffffffffffff9f =
               ParseGoogleMockStringFlag
                         ((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),flag
                          ,(string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
         (bool)in_stack_ffffffffffffff9f)) {
        while (in_stack_ffffffffffffffb0 = iVar1, in_stack_ffffffffffffffb0 != *in_RDI) {
          *(undefined8 *)(in_RSI + (long)in_stack_ffffffffffffffb0 * 8) =
               *(undefined8 *)(in_RSI + (long)(in_stack_ffffffffffffffb0 + 1) * 8);
          iVar1 = in_stack_ffffffffffffffb0 + 1;
        }
        *in_RDI = *in_RDI + -1;
        local_14 = local_14 + -1;
      }
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void InitGoogleMockImpl(int* argc, CharType** argv) {
  // Makes sure Google Test is initialized.  InitGoogleTest() is
  // idempotent, so it's fine if the user has already called it.
  InitGoogleTest(argc, argv);
  if (*argc <= 0) return;

  for (int i = 1; i != *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    // Do we see a Google Mock flag?
    if (ParseGoogleMockBoolFlag(arg, "catch_leaked_mocks",
                                &GMOCK_FLAG(catch_leaked_mocks)) ||
        ParseGoogleMockStringFlag(arg, "verbose", &GMOCK_FLAG(verbose))) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }
}